

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::visitYieldStatement(CodegenVisitor *this,YieldStatement *yieldStmt)

{
  size_type sVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQFuncState *this_00;
  anon_union_4_2_91d81cc7_for_SQInstruction_0 local_20;
  undefined2 local_1c;
  undefined1 local_1a;
  undefined1 local_19;
  
  sVar1 = (this->_fs->_instructions)._size;
  this->_fs->_bgenerator = true;
  (*(this->super_Visitor)._vptr_Visitor[0x20])();
  if ((yieldStmt->super_TerminateStatement)._arg == (Expr *)0x0) {
    this_00 = this->_fs;
    this_00->_returnexp = -1;
    SVar2 = SQFuncState::GetStackSize(this_00);
    local_1c = 0xff3b;
    local_20._arg1 = 0;
    local_1a = (undefined1)SVar2;
  }
  else {
    this_00 = this->_fs;
    this_00->_returnexp = (ulong)(sVar1 - 1) + 1;
    SVar2 = SQFuncState::PopTarget(this_00);
    SVar3 = SQFuncState::GetStackSize(this->_fs);
    local_1c = 0x13b;
    local_20._arg1 = (SQInt32)SVar2;
    local_1a = (undefined1)SVar3;
  }
  local_19 = 0;
  SQFuncState::AddInstruction(this_00,(SQInstruction *)&local_20);
  return;
}

Assistant:

void CodegenVisitor::visitYieldStatement(YieldStatement *yieldStmt) {
    SQInteger retexp = _fs->GetCurrentPos() + 1;
    _fs->_bgenerator = true;
    visitTerminateStatement(yieldStmt);

    if (yieldStmt->argument()) {
        _fs->_returnexp = retexp;
        _fs->AddInstruction(_OP_YIELD, 1, _fs->PopTarget(), _fs->GetStackSize());
    }
    else {
        _fs->_returnexp = -1;
        _fs->AddInstruction(_OP_YIELD, 0xFF, 0, _fs->GetStackSize());
    }
}